

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

bool __thiscall
SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Equals
          (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this,
          SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *other)

{
  Type pOVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *ppOVar5;
  undefined1 local_50 [8];
  Iterator iter;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *local_38;
  
  local_50 = (undefined1  [8])this;
  iter.list = this;
  iter.current = &other->super_SListNodeBase<Memory::ArenaAllocator>;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_38 = other;
  while( true ) {
    if (this == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_00465d7e;
      *puVar4 = 0;
      this = iter.list;
    }
    iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
                (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])iter.list == local_50) break;
    if (local_38 == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
LAB_00465d7e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    local_38 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
               (local_38->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if (local_38 == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)iter.current) {
      return false;
    }
    ppOVar5 = Iterator::Data((Iterator *)local_50);
    pOVar1 = *ppOVar5;
    ppOVar5 = Iterator::Data((Iterator *)&iter.current);
    this = iter.list;
    if (pOVar1 != *ppOVar5) {
      return false;
    }
  }
  iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  if (local_38 == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar3) goto LAB_00465d7e;
    *puVar4 = 0;
  }
  return (local_38->super_SListNodeBase<Memory::ArenaAllocator>).next == iter.current;
}

Assistant:

bool Equals(SListBase const& other)
    {
        SListBase::Iterator iter(this);
        SListBase::Iterator iter2(&other);
        while (iter.Next())
        {
            if (!iter2.Next() || iter.Data() != iter2.Data())
            {
                return false;
            }
        }
        return !iter2.Next();
    }